

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

TransListCoverageBinInitializerSyntax * __thiscall
slang::parsing::Parser::parseTransListInitializer(Parser *this)

{
  bool bVar1;
  int iVar2;
  TransSetSyntax *pTVar3;
  undefined4 extraout_var;
  TransListCoverageBinInitializerSyntax *pTVar4;
  EVP_PKEY_CTX *src;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_130;
  long local_120;
  undefined8 uStack_118;
  undefined8 local_108;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_f8 [4];
  
  local_f8[0].len = 0;
  local_f8[0].cap = 8;
  local_f8[0].data_ = (pointer)local_f8[0].firstElement;
  while( true ) {
    pTVar3 = parseTransSet(this);
    local_130._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pTVar3;
    local_120._0_1_ = 1;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_f8,(TokenOrSyntax *)&local_130._M_first);
    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
    if (!bVar1) break;
    local_130._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase);
    local_120 = (ulong)local_120._1_7_ << 8;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (local_f8,(TokenOrSyntax *)&local_130._M_first);
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_f8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_108 = CONCAT44(extraout_var,iVar2);
  local_130._8_4_ = 3;
  local_120 = 0;
  uStack_118 = 0;
  local_130._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006ddbc8;
  pTVar4 = slang::syntax::SyntaxFactory::transListCoverageBinInitializer
                     (&this->factory,
                      (SeparatedSyntaxList<slang::syntax::TransSetSyntax> *)&local_130._M_first);
  if (local_f8[0].data_ != (pointer)local_f8[0].firstElement) {
    operator_delete(local_f8[0].data_);
  }
  return pTVar4;
}

Assistant:

TransListCoverageBinInitializerSyntax& Parser::parseTransListInitializer() {
    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        buffer.push_back(&parseTransSet());
        if (!peek(TokenKind::Comma))
            break;

        buffer.push_back(consume());
    }

    return factory.transListCoverageBinInitializer(buffer.copy(alloc));
}